

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall
QCss::ValueExtractor::extractPalette
          (ValueExtractor *this,QBrush *foreground,QBrush *selectedForeground,
          QBrush *selectedBackground,QBrush *alternateBackground,QBrush *placeHolderTextForeground,
          QBrush *accent)

{
  int iVar1;
  Declaration *pDVar2;
  bool bVar3;
  _Head_base<0UL,_QBrushData_*,_false> _Var4;
  QBrush *pQVar5;
  QPalette *pal;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  _Head_base<0UL,_QBrushData_*,_false> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->declarations).d.size == 0) {
    bVar3 = false;
  }
  else {
    lVar7 = 0;
    uVar6 = 0;
    bVar3 = false;
    do {
      pDVar2 = (this->declarations).d.ptr;
      pal = (QPalette *)((long)&(pDVar2->d).d.ptr + lVar7);
      iVar1 = *(int *)(*(long *)((long)&(pDVar2->d).d.ptr + lVar7) + 0x20);
      if (0x26 < iVar1) {
        if (iVar1 == 0x27) {
          Declaration::brushValue((Declaration *)&local_40,pal);
          pQVar5 = alternateBackground;
        }
        else if (iVar1 == 0x6f) {
          Declaration::brushValue((Declaration *)&local_40,pal);
          pQVar5 = placeHolderTextForeground;
        }
        else {
          if (iVar1 != 0x70) goto LAB_005dd21d;
          Declaration::brushValue((Declaration *)&local_40,pal);
          pQVar5 = accent;
        }
        goto LAB_005dd203;
      }
      if (iVar1 == 2) {
        Declaration::brushValue((Declaration *)&local_40,pal);
        _Var4._M_head_impl =
             (foreground->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
             super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
        (foreground->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = local_40._M_head_impl;
LAB_005dd20e:
        local_40._M_head_impl = _Var4._M_head_impl;
        QBrush::~QBrush((QBrush *)&local_40);
        bVar3 = true;
      }
      else {
        if (iVar1 == 0x18) {
          Declaration::brushValue((Declaration *)&local_40,pal);
          pQVar5 = selectedForeground;
LAB_005dd203:
          _Var4._M_head_impl =
               (pQVar5->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
          (pQVar5->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
          super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
          super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = local_40._M_head_impl;
          goto LAB_005dd20e;
        }
        if (iVar1 == 0x19) {
          Declaration::brushValue((Declaration *)&local_40,pal);
          pQVar5 = selectedBackground;
          goto LAB_005dd203;
        }
      }
LAB_005dd21d:
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 8;
    } while (uVar6 < (ulong)(this->declarations).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool ValueExtractor::extractPalette(QBrush *foreground,
                                    QBrush *selectedForeground,
                                    QBrush *selectedBackground,
                                    QBrush *alternateBackground,
                                    QBrush *placeHolderTextForeground,
                                    QBrush *accent)
{
    bool hit = false;
    for (int i = 0; i < declarations.size(); ++i) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case Color: *foreground = decl.brushValue(pal); break;
        case QtSelectionForeground: *selectedForeground = decl.brushValue(pal); break;
        case QtSelectionBackground: *selectedBackground = decl.brushValue(pal); break;
        case QtAlternateBackground: *alternateBackground = decl.brushValue(pal); break;
        case QtPlaceHolderTextColor: *placeHolderTextForeground = decl.brushValue(pal); break;
        case QtAccent: *accent = decl.brushValue(pal); break;
        default: continue;
        }
        hit = true;
    }
    return hit;
}